

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

int fl_utf_strncasecmp(char *s1,char *s2,int n)

{
  uint ucs;
  uint ucs_00;
  int iVar1;
  int iVar2;
  int res;
  uint u2;
  uint u1;
  int l2;
  int l1;
  int i;
  int n_local;
  char *s2_local;
  char *s1_local;
  
  l2 = 0;
  l1 = n;
  _i = s2;
  s2_local = s1;
  while( true ) {
    if (l1 <= l2) {
      return 0;
    }
    if ((*s2_local == '\0') && (*_i == '\0')) break;
    ucs = fl_utf8decode(s2_local,(char *)0x0,(wchar_t *)&u1);
    ucs_00 = fl_utf8decode(_i,(char *)0x0,(wchar_t *)&u2);
    iVar1 = XUtf8Tolower(ucs);
    iVar2 = XUtf8Tolower(ucs_00);
    if (iVar1 - iVar2 != 0) {
      return iVar1 - iVar2;
    }
    s2_local = s2_local + (int)u1;
    _i = _i + (int)u2;
    l2 = l2 + 1;
  }
  return 0;
}

Assistant:

int fl_utf_strncasecmp(const char *s1, const char *s2, int n)
{
  int i;
  for (i = 0; i < n; i++) {
    int l1, l2;
    unsigned int u1, u2;

    if (*s1==0 && *s2==0) return 0; // all compared equal, return 0

    u1 = fl_utf8decode(s1, 0, &l1);
    u2 = fl_utf8decode(s2, 0, &l2);
    int res = XUtf8Tolower(u1) - XUtf8Tolower(u2);
    if (res) return res;
    s1 += l1;
    s2 += l2;
  }
  return 0;
}